

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

lua_Unsigned luaH_getn(Table *t)

{
  byte bVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong key;
  ulong uVar9;
  
  uVar6 = t->alimit;
  uVar7 = (ulong)uVar6;
  if (uVar7 != 0) {
    pTVar2 = t->array;
    uVar4 = uVar6 - 1;
    uVar9 = (ulong)uVar4;
    if ((pTVar2[uVar9].tt_ & 0xf) == 0) {
      uVar5 = 0;
      if (uVar6 != 1) {
        if ((pTVar2[uVar6 - 2].tt_ & 0xf) != 0) {
          if ((uVar4 & uVar6 - 2) == 0) {
            return uVar9;
          }
          if (-1 < (char)t->flags && (uVar6 & uVar4) != 0) {
            return uVar9;
          }
          t->alimit = uVar4;
          t->flags = t->flags | 0x80;
          return uVar9;
        }
        uVar5 = 0;
        do {
          uVar4 = (int)uVar7 + uVar5 >> 1;
          if ((pTVar2[uVar4 - 1].tt_ & 0xf) == 0) {
            uVar7 = (ulong)uVar4;
            uVar4 = uVar5;
          }
          uVar5 = uVar4;
        } while (1 < (int)uVar7 - uVar5);
      }
      bVar1 = t->flags;
      if ((((char)bVar1 < '\0') ||
          (uVar6 = uVar6 - (uVar6 >> 1 & 0x55555555),
          uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333),
          ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) &&
         (uVar6 = luaH_realasize(t), uVar6 >> 1 < uVar5)) {
        t->alimit = uVar5;
        t->flags = bVar1 | 0x80;
      }
      return (ulong)uVar5;
    }
  }
  if (((char)t->flags < '\0') &&
     (uVar4 = uVar6 - (uVar6 >> 1 & 0x55555555),
     uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
     1 < ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    pTVar2 = t->array;
    if ((pTVar2[uVar7].tt_ & 0xf) == 0) {
      return uVar7;
    }
    uVar4 = luaH_realasize(t);
    if ((pTVar2[uVar4 - 1].tt_ & 0xf) == 0) {
      uVar5 = uVar4 - uVar6;
      while (1 < uVar5) {
        uVar6 = uVar4 + (uint)uVar7 >> 1;
        if ((pTVar2[uVar6 - 1].tt_ & 0xf) == 0) {
          uVar4 = uVar6;
          uVar6 = (uint)uVar7;
        }
        uVar7 = (ulong)uVar6;
        uVar5 = uVar4 - uVar6;
      }
      t->alimit = uVar6;
      return (ulong)uVar6;
    }
    uVar7 = (ulong)uVar4;
  }
  iVar8 = (int)uVar7;
  if ((t->lastfree != (Node *)0x0) &&
     (pTVar2 = luaH_getint(t,(ulong)(iVar8 + 1)), (pTVar2->tt_ & 0xf) != 0)) {
    uVar9 = (ulong)(iVar8 + (uint)(iVar8 == 0));
    do {
      uVar7 = uVar9;
      if (uVar7 >> 0x3e != 0) {
        uVar9 = 0x7fffffffffffffff;
        pTVar2 = luaH_getint(t,0x7fffffffffffffff);
        if ((pTVar2->tt_ & 0xf) != 0) {
          return 0x7fffffffffffffff;
        }
        break;
      }
      uVar9 = uVar7 * 2;
      pTVar2 = luaH_getint(t,uVar9);
    } while ((pTVar2->tt_ & 0xf) != 0);
    uVar3 = uVar9 - uVar7;
    while (1 < uVar3) {
      key = uVar9 + uVar7 >> 1;
      pTVar2 = luaH_getint(t,key);
      if ((pTVar2->tt_ & 0xf) != 0) {
        uVar7 = key;
        key = uVar9;
      }
      uVar9 = key;
      uVar3 = key - uVar7;
    }
  }
  return uVar7;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int limit = t->alimit;
  if (limit > 0 && isempty(&t->array[limit - 1])) {  /* (1)? */
    /* there must be a boundary before 'limit' */
    if (limit >= 2 && !isempty(&t->array[limit - 2])) {
      /* 'limit - 1' is a boundary; can it be a new limit? */
      if (ispow2realasize(t) && !ispow2(limit - 1)) {
        t->alimit = limit - 1;
        setnorealasize(t);  /* now 'alimit' is not the real size */
      }
      return limit - 1;
    }
    else {  /* must search for a boundary in [0, limit] */
      unsigned int boundary = binsearch(t->array, 0, limit);
      /* can this boundary represent the real size of the array? */
      if (ispow2realasize(t) && boundary > luaH_realasize(t) / 2) {
        t->alimit = boundary;  /* use it as the new limit */
        setnorealasize(t);
      }
      return boundary;
    }
  }
  /* 'limit' is zero or present in table */
  if (!limitequalsasize(t)) {  /* (2)? */
    /* 'limit' > 0 and array has more elements after 'limit' */
    if (isempty(&t->array[limit]))  /* 'limit + 1' is empty? */
      return limit;  /* this is the boundary */
    /* else, try last element in the array */
    limit = luaH_realasize(t);
    if (isempty(&t->array[limit - 1])) {  /* empty? */
      /* there must be a boundary in the array after old limit,
         and it must be a valid new limit */
      unsigned int boundary = binsearch(t->array, t->alimit, limit);
      t->alimit = boundary;
      return boundary;
    }
    /* else, new limit is present in the table; check the hash part */
  }
  /* (3) 'limit' is the last element and either is zero or present in table */
  lua_assert(limit == luaH_realasize(t) &&
             (limit == 0 || !isempty(&t->array[limit - 1])));
  if (isdummy(t) || isempty(luaH_getint(t, cast(lua_Integer, limit + 1))))
    return limit;  /* 'limit + 1' is absent */
  else  /* 'limit + 1' is also present */
    return hash_search(t, limit);
}